

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variablebyte.h
# Opt level: O2

void __thiscall
FastPForLib::VariableByte::_encodeArray<unsigned_long>
          (VariableByte *this,unsigned_long *in,size_t length,uint32_t *out,size_t *nvalue)

{
  size_t bytenvalue;
  ulong local_20;
  
  local_20 = *nvalue << 2;
  encodeToByteArray<unsigned_long>(this,in,length,(uint8_t *)out,&local_20);
  for (; ((int)out + (int)local_20 & 3U) != 0; local_20 = local_20 + 1) {
    *(undefined1 *)((long)out + local_20) = 0;
  }
  *nvalue = local_20 >> 2;
  return;
}

Assistant:

void _encodeArray(const T *in, const size_t length, uint32_t *out,
                    size_t &nvalue) {
    uint8_t *bout = reinterpret_cast<uint8_t *>(out);
    const uint8_t *const initbout = reinterpret_cast<uint8_t *>(out);
    size_t bytenvalue = nvalue * sizeof(uint32_t);
    encodeToByteArray(in, length, bout, bytenvalue);
    bout += bytenvalue;
    while (needPaddingTo32Bits(bout)) {
      *bout++ = 0;
    }
    const size_t storageinbytes = bout - initbout;
    assert((storageinbytes % 4) == 0);
    nvalue = storageinbytes / 4;
  }